

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1553.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  CURLMcode CVar4;
  undefined8 uVar5;
  long lVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  CURLMcode ec_10;
  undefined1 local_9c [4];
  undefined1 auStack_98 [4];
  int num;
  CURLcode local_88;
  CURLcode local_84;
  CURLMcode ec_9;
  CURLMcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_58;
  int local_4c;
  undefined8 uStack_48;
  int counter;
  curl_mime *mime;
  curl_mimepart *field;
  CURLcode local_30;
  int res;
  int i;
  int still_running;
  CURLM *multi;
  CURL *curls;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _i = 0;
  local_30 = CURLE_OK;
  field._4_4_ = CURLE_OK;
  mime = (curl_mime *)0x0;
  uStack_48 = 0;
  local_4c = 1;
  curls = (CURL *)URL;
  _ec_1 = tutil_tvnow();
  tv_test_start.tv_sec = _ec_1;
  tv_test_start.tv_usec = local_58;
  CVar3 = curl_global_init(3);
  uVar2 = _stderr;
  ec_2 = CVar3;
  if (CVar3 != CURLE_OK) {
    uVar5 = curl_easy_strerror(CVar3);
    curl_mfprintf(uVar2,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                  ,0x38,CVar3,uVar5);
    field._4_4_ = ec_2;
  }
  if (field._4_4_ == CURLE_OK) {
    _i = curl_multi_init();
    if (_i == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                    ,0x3a);
      field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CIPHER;
    }
    if (field._4_4_ == CURLE_OK) {
      multi = (CURLM *)curl_easy_init();
      if (multi == (CURLM *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                      ,0x3c);
        field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_PEER_FAILED_VERIFICATION;
      }
      if (field._4_4_ == CURLE_OK) {
        uStack_48 = curl_mime_init(multi);
        mime = (curl_mime *)curl_mime_addpart(uStack_48);
        curl_mime_name(mime,"name");
        curl_mime_data(mime,"value",0xffffffffffffffff);
        CVar3 = curl_easy_setopt(multi,0x2712,curls);
        uVar2 = _stderr;
        ec_3 = CVar3;
        if (CVar3 != CURLE_OK) {
          uVar5 = curl_easy_strerror(CVar3);
          curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                        ,0x43,CVar3,uVar5);
          field._4_4_ = ec_3;
        }
        if (field._4_4_ == CURLE_OK) {
          CVar3 = curl_easy_setopt(multi,0x2a,1);
          uVar2 = _stderr;
          ec_4 = CVar3;
          if (CVar3 != CURLE_OK) {
            uVar5 = curl_easy_strerror(CVar3);
            curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                          ,0x44,CVar3,uVar5);
            field._4_4_ = ec_4;
          }
          if (field._4_4_ == CURLE_OK) {
            CVar3 = curl_easy_setopt(multi,0x29,1);
            uVar2 = _stderr;
            ec_5 = CVar3;
            if (CVar3 != CURLE_OK) {
              uVar5 = curl_easy_strerror(CVar3);
              curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                            ,0x45,CVar3,uVar5);
              field._4_4_ = ec_5;
            }
            if (field._4_4_ == CURLE_OK) {
              CVar3 = curl_easy_setopt(multi,0x281d,uStack_48);
              uVar2 = _stderr;
              ec_6 = CVar3;
              if (CVar3 != CURLE_OK) {
                uVar5 = curl_easy_strerror(CVar3);
                curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                              ,0x46,CVar3,uVar5);
                field._4_4_ = ec_6;
              }
              if (field._4_4_ == CURLE_OK) {
                CVar3 = curl_easy_setopt(multi,0x2715,"u:s");
                uVar2 = _stderr;
                ec_7 = CVar3;
                if (CVar3 != CURLE_OK) {
                  uVar5 = curl_easy_strerror(CVar3);
                  curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                ,0x47,CVar3,uVar5);
                  field._4_4_ = ec_7;
                }
                if (field._4_4_ == CURLE_OK) {
                  CVar4 = curl_easy_setopt(multi,0x4efb,xferinfo);
                  uVar2 = _stderr;
                  ec_8 = CVar4;
                  if (CVar4 != CURLM_OK) {
                    uVar5 = curl_easy_strerror(CVar4);
                    curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                  ,0x48,CVar4,uVar5);
                    field._4_4_ = ec_8;
                  }
                  if (field._4_4_ == CURLE_OK) {
                    CVar4 = curl_easy_setopt(multi,0x2b,1);
                    uVar2 = _stderr;
                    ec_9 = CVar4;
                    if (CVar4 != CURLM_OK) {
                      uVar5 = curl_easy_strerror(CVar4);
                      curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                    ,0x49,CVar4,uVar5);
                      field._4_4_ = ec_9;
                    }
                    if (field._4_4_ == CURLE_OK) {
                      CVar3 = curl_multi_add_handle(_i,multi);
                      uVar2 = _stderr;
                      local_84 = CVar3;
                      if (CVar3 != CURLE_OK) {
                        uVar5 = curl_multi_strerror(CVar3);
                        curl_mfprintf(uVar2,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                      ,0x4b,CVar3,uVar5);
                        field._4_4_ = local_84;
                      }
                      if (field._4_4_ == CURLE_OK) {
                        CVar3 = curl_multi_perform(_i,&res);
                        uVar2 = _stderr;
                        local_88 = CVar3;
                        if (CVar3 == CURLE_OK) {
                          if (res < 0) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                          ,0x4d,res);
                            field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                          }
                        }
                        else {
                          uVar5 = curl_multi_strerror(CVar3);
                          curl_mfprintf(uVar2,
                                        "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                        ,0x4d,CVar3,uVar5);
                          field._4_4_ = local_88;
                        }
                        if (field._4_4_ == CURLE_OK) {
                          _auStack_98 = tutil_tvnow();
                          tVar7.tv_usec = tv_test_start.tv_usec;
                          tVar7.tv_sec = tv_test_start.tv_sec;
                          lVar6 = tutil_tvdiff(_auStack_98,tVar7);
                          iVar1 = local_4c;
                          if (60000 < lVar6) {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                          ,0x4f);
                            field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                            iVar1 = local_4c;
                          }
                          while (local_4c = iVar1, field._4_4_ == CURLE_OK) {
                            if (res != 0) {
                              local_4c = iVar1 + -1;
                            }
                            if (res == 0 || iVar1 == 0) break;
                            field._4_4_ = curl_multi_wait(_i,0,0,60000,local_9c);
                            if (field._4_4_ != CURLE_OK) {
                              curl_mprintf("curl_multi_wait() returned %d\n",field._4_4_);
                              field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
                              break;
                            }
                            tVar7 = tutil_tvnow();
                            older.tv_usec = tv_test_start.tv_usec;
                            older.tv_sec = tv_test_start.tv_sec;
                            lVar6 = tutil_tvdiff(tVar7,older);
                            if (60000 < lVar6) {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                            ,0x5a);
                              field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                            }
                            if (field._4_4_ != CURLE_OK) break;
                            CVar3 = curl_multi_perform(_i,&res);
                            uVar2 = _stderr;
                            if (CVar3 == CURLE_OK) {
                              if (res < 0) {
                                curl_mfprintf(_stderr,
                                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                              ,0x5c,res);
                                field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                              }
                            }
                            else {
                              uVar5 = curl_multi_strerror(CVar3);
                              curl_mfprintf(uVar2,
                                            "%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                            ,0x5c,CVar3,uVar5);
                              field._4_4_ = CVar3;
                            }
                            if (field._4_4_ != CURLE_OK) break;
                            tVar7 = tutil_tvnow();
                            older_00.tv_usec = tv_test_start.tv_usec;
                            older_00.tv_sec = tv_test_start.tv_sec;
                            lVar6 = tutil_tvdiff(tVar7,older_00);
                            iVar1 = local_4c;
                            if (60000 < lVar6) {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1553.c"
                                            ,0x5e);
                              field._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                              iVar1 = local_4c;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_mime_free(uStack_48);
    curl_multi_remove_handle(_i,multi);
    curl_multi_cleanup(_i);
    curl_easy_cleanup(multi);
    curl_global_cleanup();
    if (field._4_4_ != CURLE_OK) {
      local_30 = field._4_4_;
    }
    URL_local._4_4_ = local_30;
  }
  else {
    URL_local._4_4_ = field._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = 0;
  int res = 0;
  curl_mimepart *field = NULL;
  curl_mime *mime = NULL;
  int counter = 1;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  mime = curl_mime_init(curls);
  field = curl_mime_addpart(mime);
  curl_mime_name(field, "name");
  curl_mime_data(field, "value", CURL_ZERO_TERMINATED);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_MIMEPOST, mime);
  easy_setopt(curls, CURLOPT_USERPWD, "u:s");
  easy_setopt(curls, CURLOPT_XFERINFOFUNCTION, xferinfo);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running && counter--) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

  curl_mime_free(mime);
  curl_multi_remove_handle(multi, curls);
  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}